

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compress_3d.cpp
# Opt level: O1

size_t prediction_and_quantization_3d_with_border_prediction<float>
                 (float *data,DSize_3d *size,meanInfo<float> *mean_info,double precision,
                 int capacity,int intv_radius,uchar *indicator,int *type,int *reg_params_type,
                 float **reg_unpredictable_data_pos,float **unpredictable_data_pos)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  int size_x;
  int size_y;
  int size_z;
  uchar uVar7;
  int i;
  int iVar8;
  undefined8 *__ptr;
  long lVar9;
  long lVar10;
  void *__s;
  long lVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  float *pfVar20;
  float *pfVar21;
  int iVar22;
  float *pfVar23;
  long lVar24;
  size_t __size;
  float *reg_params_pos;
  long lVar25;
  long lVar26;
  float fVar27;
  double dVar28;
  undefined1 auVar29 [16];
  double dVar30;
  float fVar31;
  float fVar32;
  double reg_precisions [4];
  size_t local_158;
  void *local_150;
  float *local_140;
  ulong local_128;
  ulong local_120;
  float *local_f8;
  double adStack_58 [5];
  
  __ptr = (undefined8 *)malloc(size->num_blocks * 0x10 + 0x10);
  *__ptr = 0;
  __ptr[1] = 0;
  fVar27 = (float)(precision * 0.1 * 0.25);
  dVar28 = (double)(fVar27 / (float)size->block_size);
  lVar9 = 0;
  auVar29 = _DAT_0010a070;
  do {
    if (SUB164(auVar29 ^ _DAT_0010a020,4) == DAT_0010a080._4_4_ &&
        SUB164(auVar29 ^ _DAT_0010a020,0) < (int)DAT_0010a080) {
      adStack_58[lVar9] = dVar28;
      adStack_58[lVar9 + 1] = dVar28;
    }
    lVar9 = lVar9 + 2;
    lVar10 = auVar29._8_8_;
    auVar29._0_8_ = auVar29._0_8_ + 2;
    auVar29._8_8_ = lVar10 + 2;
  } while (lVar9 != 4);
  adStack_58[3] = (double)fVar27;
  sVar4 = size->d3;
  lVar10 = size->d2 + 1;
  lVar9 = sVar4 + 1;
  lVar25 = lVar9 * lVar10;
  __size = ((long)size->block_size + 1) * lVar25 * 4;
  __s = malloc(__size);
  memset(__s,0,__size);
  if (size->num_x == 0) {
    local_158 = 0;
  }
  else {
    reg_params_pos = (float *)(__ptr + 2);
    iVar8 = capacity + -2;
    if (mean_info->use_mean == false) {
      iVar8 = capacity;
    }
    lVar2 = sVar4 * 4 + 4;
    local_128 = 0;
    local_158 = 0;
    do {
      if (size->num_y != 0) {
        local_120 = 0;
        local_150 = __s;
        local_f8 = data;
        do {
          uVar12 = size->num_z;
          if (uVar12 != 0) {
            local_140 = local_f8;
            uVar14 = 0;
            do {
              iVar22 = size->block_size;
              lVar15 = (long)iVar22;
              size_x = (int)size->d1 - (int)local_128 * iVar22;
              if ((local_128 + 1) * lVar15 < size->d1) {
                size_x = iVar22;
              }
              size_y = (int)size->d2 - (int)local_120 * iVar22;
              if ((local_120 + 1) * lVar15 < size->d2) {
                size_y = iVar22;
              }
              uVar1 = uVar14 + 1;
              size_z = (int)size->d3 - (int)uVar14 * iVar22;
              if (lVar15 * uVar1 < size->d3) {
                size_z = iVar22;
              }
              iVar22 = size_y;
              if (size_x < size_y) {
                iVar22 = size_x;
              }
              if (size_z <= iVar22) {
                iVar22 = size_z;
              }
              if (iVar22 < 4) {
                uVar7 = '\0';
              }
              else {
                compute_regression_coeffcients_3d<float>
                          (local_140,size_x,size_y,size_z,size->dim0_offset,size->dim1_offset,
                           reg_params_pos);
                iVar22 = sz_blockwise_selection_3d<float>
                                   (local_140,mean_info,size->dim0_offset,size->dim1_offset,iVar22,
                                    (float)(precision * 1.22),reg_params_pos);
                uVar7 = (uchar)iVar22;
              }
              *indicator = uVar7;
              lVar15 = (long)size_z;
              if (uVar7 == '\0') {
                if (0 < size_x) {
                  sVar5 = size->dim0_offset;
                  sVar6 = size->dim1_offset;
                  lVar11 = (long)local_150 + lVar9 * 4 + lVar25 * 4 + 4;
                  iVar22 = 0;
                  pfVar21 = local_140;
                  do {
                    if (0 < size_y) {
                      bVar3 = mean_info->use_mean;
                      lVar24 = lVar11 + (lVar25 * 4 + sVar4 * 4 ^ 0xfffffffffffffffc);
                      lVar26 = lVar11 + lVar25 * -4;
                      lVar19 = lVar11 + (sVar4 * 4 ^ 0xfffffffffffffffc);
                      iVar13 = 0;
                      pfVar23 = *unpredictable_data_pos;
                      do {
                        pfVar20 = pfVar23;
                        if (0 < size_z) {
                          lVar17 = 0;
                          iVar18 = size_z;
                          do {
                            if (((bVar3 & 1U) == 0) ||
                               (fVar27 = mean_info->mean,
                               precision <= (double)ABS(*(float *)((long)pfVar21 + lVar17) - fVar27)
                               )) {
                              fVar31 = ((((*(float *)(lVar11 + -4 + lVar17) +
                                           *(float *)(lVar19 + lVar17) + *(float *)(lVar26 + lVar17)
                                          ) - *(float *)(lVar19 + -4 + lVar17)) -
                                        *(float *)(lVar26 + -4 + lVar17)) -
                                       *(float *)(lVar24 + lVar17)) +
                                       *(float *)(lVar24 + -4 + lVar17);
                              fVar27 = *(float *)((long)pfVar21 + lVar17);
                              fVar32 = fVar27 - fVar31;
                              dVar28 = (double)ABS(fVar32) / precision + 1.0;
                              if ((double)iVar8 <= dVar28) {
LAB_0010519e:
                                *(float *)(lVar11 + lVar17) = fVar27;
                                pfVar20 = pfVar23 + 1;
                                *unpredictable_data_pos = pfVar20;
                                *pfVar23 = fVar27;
                                iVar16 = 0;
                                pfVar23 = pfVar20;
                              }
                              else {
                                if (fVar32 <= 0.0) {
                                  dVar28 = -dVar28;
                                }
                                fVar31 = (float)((double)((int)(dVar28 * 0.5) * 2) * precision +
                                                (double)fVar31);
                                *(float *)(lVar11 + lVar17) = fVar31;
                                if (precision < (double)ABS(fVar31 - fVar27)) goto LAB_0010519e;
                                iVar16 = (int)(dVar28 * 0.5) + intv_radius;
                              }
                              *(int *)((long)type + lVar17) = iVar16;
                            }
                            else {
                              *(undefined4 *)((long)type + lVar17) = 1;
                              *(float *)(lVar11 + lVar17) = fVar27;
                            }
                            lVar17 = lVar17 + 4;
                            iVar18 = iVar18 + -1;
                          } while (iVar18 != 0);
                          type = (int *)((long)type + lVar17);
                          pfVar21 = (float *)((long)pfVar21 + lVar17);
                        }
                        lVar11 = lVar11 + lVar2;
                        pfVar21 = pfVar21 + (sVar6 - lVar15);
                        iVar13 = iVar13 + 1;
                        lVar24 = lVar24 + lVar2;
                        lVar26 = lVar26 + lVar2;
                        lVar19 = lVar19 + lVar2;
                        pfVar23 = pfVar20;
                      } while (iVar13 != size_y);
                    }
                    lVar11 = lVar11 + (lVar10 - size_y) * lVar9 * 4;
                    pfVar21 = pfVar21 + (sVar5 - sVar6 * (long)size_y);
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != size_x);
                }
              }
              else {
                pfVar21 = *reg_unpredictable_data_pos;
                lVar11 = 0;
                do {
                  fVar27 = reg_params_pos[lVar11];
                  dVar28 = adStack_58[lVar11];
                  fVar31 = fVar27 - reg_params_pos[lVar11 + -4];
                  dVar30 = (double)ABS(fVar31) / dVar28 + 1.0;
                  if (65536.0 <= dVar30) {
LAB_00104dd1:
                    reg_params_pos[lVar11] = fVar27;
                    *reg_unpredictable_data_pos = pfVar21 + 1;
                    *pfVar21 = fVar27;
                    iVar22 = 0;
                    pfVar21 = pfVar21 + 1;
                  }
                  else {
                    if (fVar31 <= 0.0) {
                      dVar30 = -dVar30;
                    }
                    fVar31 = (float)((double)((int)(dVar30 * 0.5) * 2) * dVar28 +
                                    (double)reg_params_pos[lVar11 + -4]);
                    reg_params_pos[lVar11] = fVar31;
                    if (dVar28 < (double)ABS(fVar31 - fVar27)) goto LAB_00104dd1;
                    iVar22 = (int)(dVar30 * 0.5) + 0x8000;
                  }
                  reg_params_type[lVar11] = iVar22;
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 4);
                if (0 < size_x) {
                  sVar5 = size->dim0_offset;
                  sVar6 = size->dim1_offset;
                  lVar11 = (long)local_150 + lVar9 * 4 + lVar25 * 4 + 4;
                  pfVar21 = *unpredictable_data_pos;
                  iVar22 = 0;
                  pfVar23 = local_140;
                  do {
                    if (0 < size_y) {
                      iVar13 = 0;
                      pfVar20 = pfVar21;
                      do {
                        if (0 < size_z) {
                          lVar26 = 0;
                          lVar24 = 0;
                          do {
                            fVar31 = (float)(int)lVar24 * reg_params_pos[2] +
                                     *reg_params_pos * (float)iVar22 +
                                     reg_params_pos[1] * (float)iVar13 + reg_params_pos[3];
                            fVar27 = pfVar23[lVar24];
                            fVar32 = fVar27 - fVar31;
                            dVar28 = (double)ABS(fVar32) / precision + 1.0;
                            if ((double)capacity <= dVar28) {
LAB_00104f47:
                              *(float *)(lVar11 + lVar24 * 4) = fVar27;
                              pfVar21 = pfVar20 + 1;
                              *unpredictable_data_pos = pfVar21;
                              *pfVar20 = fVar27;
                              iVar18 = 0;
                              pfVar20 = pfVar21;
                            }
                            else {
                              if (fVar32 <= 0.0) {
                                dVar28 = -dVar28;
                              }
                              fVar31 = (float)((double)((int)(dVar28 * 0.5) * 2) * precision +
                                              (double)fVar31);
                              *(float *)(lVar11 + lVar24 * 4) = fVar31;
                              if (precision < (double)ABS(fVar31 - fVar27)) goto LAB_00104f47;
                              iVar18 = (int)(dVar28 * 0.5) + intv_radius;
                            }
                            type[lVar24] = iVar18;
                            lVar24 = lVar24 + 1;
                            lVar26 = lVar26 + -4;
                          } while (size_z != (int)lVar24);
                          type = (int *)((long)type - lVar26);
                          pfVar23 = (float *)((long)pfVar23 - lVar26);
                        }
                        lVar11 = lVar11 + lVar2;
                        pfVar23 = pfVar23 + (sVar6 - lVar15);
                        iVar13 = iVar13 + 1;
                      } while (iVar13 != size_y);
                    }
                    lVar11 = lVar11 + (lVar10 - size_y) * lVar9 * 4;
                    pfVar23 = pfVar23 + (sVar5 - sVar6 * (long)size_y);
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != size_x);
                }
                local_158 = local_158 + 1;
                reg_params_pos = reg_params_pos + 4;
                reg_params_type = reg_params_type + 4;
              }
              local_150 = (void *)((long)local_150 + (long)size->block_size * 4);
              indicator = indicator + 1;
              local_140 = local_140 + lVar15;
              uVar12 = size->num_z;
              uVar14 = uVar1;
            } while (uVar1 < uVar12);
          }
          local_f8 = local_f8 + size->dim1_offset * (long)size->block_size;
          local_150 = (void *)((long)local_150 + (lVar9 - uVar12) * (long)size->block_size * 4);
          local_120 = local_120 + 1;
        } while (local_120 < size->num_y);
      }
      iVar22 = size->block_size;
      memcpy(__s,(void *)((long)__s + lVar25 * iVar22 * 4),lVar25 * 4);
      data = data + (long)iVar22 * size->dim0_offset;
      local_128 = local_128 + 1;
    } while (local_128 < size->num_x);
  }
  free(__s);
  free(__ptr);
  return local_158;
}

Assistant:

size_t
prediction_and_quantization_3d_with_border_prediction(const T * data, const DSize_3d& size, const meanInfo<T>& mean_info, double precision,
	int capacity, int intv_radius, unsigned char * indicator, int * type, 
	int * reg_params_type, float *& reg_unpredictable_data_pos, T *& unpredictable_data_pos){
	const float noise = precision * LorenzeNoise3d;
	int * type_pos = type;
	unsigned char * indicator_pos = indicator;
	float * reg_params = (float *) malloc(RegCoeffNum3d * (size.num_blocks+1) * sizeof(float));
	for(int i=0; i<RegCoeffNum3d; i++)
		reg_params[i] = 0;
	float * reg_params_pos = reg_params + RegCoeffNum3d;
	int * reg_params_type_pos = reg_params_type;
	double reg_precisions[RegCoeffNum3d];
	float rel_param_err = RegErrThreshold * precision / RegCoeffNum3d;
	for(int i=0; i<RegCoeffNum3d-1; i++) 
		reg_precisions[i] = rel_param_err / size.block_size;
	reg_precisions[RegCoeffNum3d - 1] = rel_param_err;
	// maintain a buffer of (block_size+1)*(r2+1)*(r3+1)
	size_t buffer_dim0_offset = (size.d2+1)*(size.d3+1);
	size_t buffer_dim1_offset = size.d3+1;
	T * pred_buffer = (T *) malloc((size.block_size+1)*(size.d2+1)*(size.d3+1)*sizeof(T));
	memset(pred_buffer, 0, (size.block_size+1)*(size.d2+1)*(size.d3+1)*sizeof(T));
	size_t reg_count = 0;
	int capacity_lorenzo = mean_info.use_mean ? capacity - 2 : capacity;
	const T * x_data_pos = data;
	for(size_t i=0; i<size.num_x; i++){
		const T * y_data_pos = x_data_pos;
		T * pred_buffer_pos = pred_buffer;
		for(size_t j=0; j<size.num_y; j++){
			const T * z_data_pos = y_data_pos;
			for(size_t k=0; k<size.num_z; k++){
				int size_x = ((i+1)*size.block_size < size.d1) ? size.block_size : size.d1 - i*size.block_size;
				int size_y = ((j+1)*size.block_size < size.d2) ? size.block_size : size.d2 - j*size.block_size;
				int size_z = ((k+1)*size.block_size < size.d3) ? size.block_size : size.d3 - k*size.block_size;
				int min_size = MIN(size_x, size_y);
				min_size = MIN(min_size, size_z);
				// size of block is less than some threshold
				if(min_size < RegThresholdSize3d){
					*indicator_pos = 0;
				}
				else{
					compute_regression_coeffcients_3d(z_data_pos, size_x, size_y, size_z, size.dim0_offset, size.dim1_offset, reg_params_pos);
					*indicator_pos = sz_blockwise_selection_3d(z_data_pos, mean_info, size.dim0_offset, size.dim1_offset, min_size, noise, reg_params_pos);
				}
				if(*indicator_pos){
					// regression
					compress_regression_coefficient_3d(reg_precisions, reg_params_pos, reg_params_type_pos, reg_unpredictable_data_pos);
					block_pred_and_quant_regression_3d_with_buffer(z_data_pos, reg_params_pos, pred_buffer_pos, precision, capacity, intv_radius, 
						size_x, size_y, size_z, buffer_dim0_offset, buffer_dim1_offset, size.dim0_offset, size.dim1_offset, type_pos, unpredictable_data_pos);
					reg_count ++;
					reg_params_pos += RegCoeffNum3d;
					reg_params_type_pos += RegCoeffNum3d;
				}
				else{
					// Lorenzo
					block_pred_and_quant_lorenzo_3d(mean_info, z_data_pos, pred_buffer_pos, precision, capacity_lorenzo, intv_radius, 
						size_x, size_y, size_z, buffer_dim0_offset, buffer_dim1_offset, size.dim0_offset, size.dim1_offset, type_pos, unpredictable_data_pos);
				}
				pred_buffer_pos += size.block_size;
				indicator_pos ++;
				z_data_pos += size_z;
			}
			y_data_pos += size.block_size*size.dim1_offset;
			pred_buffer_pos += size.block_size*buffer_dim1_offset - size.block_size*size.num_z;
		}
		// copy bottom of buffer to top of buffer
		memcpy(pred_buffer, pred_buffer + size.block_size*buffer_dim0_offset, buffer_dim0_offset*sizeof(T));
		x_data_pos += size.block_size*size.dim0_offset;
	}
	free(pred_buffer);
	free(reg_params);
	return reg_count;
}